

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O2

void Gia_ManPrintDelays(Vec_Int_t *vObjs,Vec_Int_t *vStore)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p;
  int *piVar4;
  int Addition;
  int iVar5;
  
  iVar2 = vObjs->nSize;
  iVar5 = iVar2 + 100;
  p = Vec_IntAlloc(iVar5);
  p->nSize = iVar5;
  iVar5 = 0;
  memset(p->pArray,0,(long)iVar2 * 4 + 400);
  do {
    iVar2 = vObjs->nSize;
    if (iVar2 <= iVar5) {
      for (iVar5 = 0; iVar5 < iVar2; iVar5 = iVar5 + 1) {
        iVar2 = Vec_IntEntry(vObjs,iVar5);
        piVar4 = Vec_IntEntryP(vStore,iVar2);
        if (piVar4[1] == 6) {
          uVar1 = piVar4[2];
          uVar3 = Vec_IntEntry(p,*piVar4);
          printf("(%d,%d,%d)  ",(ulong)uVar1,(ulong)uVar3,(ulong)(uint)piVar4[(long)piVar4[2] + 3]);
        }
        iVar2 = vObjs->nSize;
      }
      putchar(10);
      Vec_IntFree(p);
      return;
    }
    iVar2 = Vec_IntEntry(vObjs,iVar5);
    piVar4 = Vec_IntEntryP(vStore,iVar2);
    if (piVar4[1] == 8) {
      if (piVar4[2] != 1) {
        __assert_fail("pEntry[2] == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGig.c"
                      ,0x71,"void Gia_ManPrintDelays(Vec_Int_t *, Vec_Int_t *)");
      }
      Vec_IntAddToEntry(p,piVar4[3],Addition);
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void Gia_ManPrintDelays( Vec_Int_t * vObjs, Vec_Int_t * vStore )
{
    Vec_Int_t * vFanCount = Vec_IntStart( Vec_IntSize(vObjs) + 100 );
    int i, * pEntry;//, Counter = 0;
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
    {
        pEntry = Vec_IntEntryP( vStore, Vec_IntEntry(vObjs,i) );
        if ( pEntry[1] != GIG_SEL )
            continue;
        assert( pEntry[2] == 1 );
        Vec_IntAddToEntry( vFanCount, pEntry[3], 1 );
    }
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
    {
        pEntry = Vec_IntEntryP( vStore, Vec_IntEntry(vObjs,i) );
        if ( pEntry[1] != GIG_DELAY )
            continue;
        printf( "(%d,%d,%d)  ", pEntry[2], Vec_IntEntry(vFanCount, pEntry[0]), pEntry[3+pEntry[2]] );
    }
    printf( "\n" );
    Vec_IntFree( vFanCount );
}